

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelativeWorldCoordinates.cpp
# Opt level: O2

void __thiscall
KDIS::DATA_TYPE::RelativeWorldCoordinates::SetDeltaX(RelativeWorldCoordinates *this,KFIXED16_3 *X)

{
  DataTypeBase local_28;
  short local_20;
  KFIXED<short,_(unsigned_char)__x03_> local_18;
  
  local_28._vptr_DataTypeBase = (_func_int **)&PTR__DataTypeBase_0021b1a0;
  local_20 = X->m_Val;
  KFIXED<short,_(unsigned_char)'\x03'>::operator=(&local_18,&this->m_DelX);
  DataTypeBase::~DataTypeBase(&local_18.super_DataTypeBase);
  DataTypeBase::~DataTypeBase(&local_28);
  return;
}

Assistant:

RelativeWorldCoordinates::~RelativeWorldCoordinates ()
{
}